

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O2

ON__UINT64 __thiscall ON_Buffer::Write(ON_Buffer *this,ON__UINT64 size,void *buffer)

{
  ON_BUFFER_SEGMENT *pOVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ON_BUFFER_SEGMENT *pOVar5;
  long lVar6;
  ulong uVar7;
  ON__UINT64 OVar8;
  char *sFormat;
  ON__UINT64 OVar9;
  int line_number;
  ulong __n;
  
  if (size != 0) {
    if (buffer == (void *)0x0) {
      sFormat = "size parameter > 0 and buffer parameter is null.";
      line_number = 0x3ff;
    }
    else {
      bVar2 = SetCurrentSegment(this,true);
      if (bVar2) {
        OVar9 = 0;
LAB_0047ca8c:
        if (size == 0) {
          return OVar9;
        }
        pOVar5 = this->m_current_segment;
        do {
          if (pOVar5 == (ON_BUFFER_SEGMENT *)0x0) {
            uVar3 = ON_MemoryPageSize();
            if (uVar3 < 0x1001) {
              uVar3 = 0x1000;
            }
            pOVar5 = this->m_last_segment;
            if ((pOVar5 == (ON_BUFFER_SEGMENT *)0x0) ||
               (lVar6 = pOVar5->m_segment_position1 - pOVar5->m_segment_position0,
               pOVar5->m_segment_position1 < pOVar5->m_segment_position0 || lVar6 == 0)) {
              uVar7 = 0;
            }
            else {
              uVar7 = lVar6 + 0x50;
            }
            uVar4 = uVar3 >> 1;
            if (uVar3 >> 1 < uVar7) {
              uVar4 = uVar7;
            }
            uVar7 = uVar4 << (uVar4 < uVar3 << 4);
            do {
              uVar4 = uVar7;
              if (uVar3 << 4 <= uVar4) break;
              uVar7 = uVar4 * 2;
            } while (uVar4 - 0x50 < size);
            pOVar5 = (ON_BUFFER_SEGMENT *)onmalloc(uVar4 - 0x20);
            this->m_current_segment = pOVar5;
            memset(pOVar5,0,uVar4 - 0x20);
            pOVar1 = this->m_last_segment;
            pOVar5 = this->m_current_segment;
            pOVar5->m_prev_segment = pOVar1;
            pOVar5->m_segment_buffer = (uchar *)(pOVar5 + 1);
            if (pOVar1 == (ON_BUFFER_SEGMENT *)0x0) {
              this->m_first_segment = pOVar5;
              OVar8 = pOVar5->m_segment_position0;
            }
            else {
              pOVar1->m_next_segment = pOVar5;
              OVar8 = pOVar1->m_segment_position1;
              pOVar5->m_segment_position0 = OVar8;
            }
            this->m_last_segment = pOVar5;
            pOVar5->m_segment_position1 = OVar8 + (uVar4 - 0x50);
          }
          uVar3 = this->m_current_position;
          uVar7 = pOVar5->m_segment_position0;
          if ((uVar3 < uVar7) || (uVar4 = pOVar5->m_segment_position1, uVar4 <= uVar7)) {
            sFormat = "Corrupt ON_Buffer";
            line_number = 0x437;
            goto LAB_0047cc4e;
          }
          __n = uVar4 - uVar3;
          if (uVar3 <= uVar4 && __n != 0) goto LAB_0047cba3;
          if (this->m_buffer_size < uVar4) {
            this->m_buffer_size = uVar4;
          }
          pOVar5 = pOVar5->m_next_segment;
          this->m_current_segment = pOVar5;
        } while( true );
      }
      sFormat = "Corrupt ON_Buffer";
      line_number = 0x405;
    }
LAB_0047cc4e:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
               ,line_number,"",sFormat);
  }
  return 0;
LAB_0047cba3:
  if (size <= __n) {
    __n = size;
  }
  memcpy(pOVar5->m_segment_buffer + (uVar3 - uVar7),buffer,__n);
  uVar3 = this->m_current_position + __n;
  this->m_current_position = uVar3;
  if (this->m_buffer_size < uVar3) {
    this->m_buffer_size = uVar3;
  }
  OVar9 = OVar9 + __n;
  buffer = (void *)((long)buffer + __n);
  size = size - __n;
  if (size != 0) {
    this->m_current_segment = this->m_current_segment->m_next_segment;
  }
  goto LAB_0047ca8c;
}

Assistant:

ON__UINT64 ON_Buffer::Write( ON__UINT64 size, const void* buffer )
{
  if ( 0 == size )
    return 0; // not an error condition

  if ( 0 == buffer )
  {
    ON_ERROR("size parameter > 0 and buffer parameter is null.");
    return 0;
  }

  if ( !SetCurrentSegment(true) )
  {
    ON_ERROR("Corrupt ON_Buffer");
    return 0;
  }

  // m_current_position >= m_buffer_size is ok - it is not an error condition.

  ON__UINT64 rc = 0;
  while ( size > 0 )
  {
    if ( 0 == m_current_segment )
    {
      // allocate a new segment
      const ON__UINT64 padding_size = 4*sizeof(void*); // room for os heap info
      const ON__UINT64 header_size = sizeof(*m_current_segment);
      ON__UINT64 page_size = ON_MemoryPageSize();
      if ( page_size <= 4096 )
        page_size = 4096;
      const ON__UINT64 max_malloc_size = 16*page_size;  // largest request we want to make

      ON__UINT64 malloc_size = ( 0 != m_last_segment && m_last_segment->m_segment_position1 > m_last_segment->m_segment_position0 )
                          ? padding_size + header_size + (m_last_segment->m_segment_position1 - m_last_segment->m_segment_position0)
                          : 0;
      if ( malloc_size < page_size/2 )
        malloc_size = page_size/2;      
      if ( malloc_size < max_malloc_size )
        malloc_size *= 2;
      while ( malloc_size < max_malloc_size && size > malloc_size - header_size - padding_size )
        malloc_size *= 2;

      malloc_size -= padding_size;
      // (size_t) cast is safe because malloc_size is always <= max_malloc_size = 16*page_size <  0xFFFFFFFF
      m_current_segment = (struct ON_BUFFER_SEGMENT*)onmalloc((size_t)malloc_size); 
      memset(m_current_segment,0,(size_t)malloc_size);
      m_current_segment->m_prev_segment = m_last_segment;
      m_current_segment->m_segment_buffer = (unsigned char*)(m_current_segment + 1);
      if ( 0 != m_last_segment )
      {
        m_last_segment->m_next_segment = m_current_segment;
        m_current_segment->m_segment_position0 = m_last_segment->m_segment_position1;
      }
      else
        m_first_segment = m_current_segment;
      m_last_segment = m_current_segment;
      m_current_segment->m_segment_position1 = m_current_segment->m_segment_position0 + (ON__UINT64)(malloc_size - header_size);
    }

    if (    m_current_position < m_current_segment->m_segment_position0 
         || m_current_segment->m_segment_position1 <= m_current_segment->m_segment_position0 
       )
    {
      ON_ERROR("Corrupt ON_Buffer");
      return 0;
    }

    if ( m_current_position >= m_current_segment->m_segment_position1 )
    {
      // happens when a seek puts the current position beyond the end of the buffer.
      if ( m_current_segment->m_segment_position1 > m_buffer_size )
        m_buffer_size = m_current_segment->m_segment_position1;
      m_current_segment = m_current_segment->m_next_segment;
      continue;
    }
            
    ON__UINT64 offset = m_current_position - m_current_segment->m_segment_position0;
    ON__UINT64 sz = (m_current_segment->m_segment_position1 - m_current_position);

    if ( sz > size )
      sz = size;
    memcpy( m_current_segment->m_segment_buffer + offset, buffer, (size_t)sz );
    m_current_position += sz;
    if ( m_buffer_size < m_current_position )
    {
      // wrote past the old end of the file
      m_buffer_size = m_current_position;
    }
    rc += sz;
    size -= sz;
    buffer = ((const unsigned char*)buffer) + sz;
    if ( size > 0 )
      m_current_segment = m_current_segment->m_next_segment;
  }

  return rc;
}